

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O2

bool __thiscall Husky::ServerFrame::dispose(ServerFrame *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  allocator local_49;
  string local_48;
  sockaddr_in dest;
  
  this->m_bShutdown = true;
  iVar1 = close(this->m_lsnSock);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_48,"error [%s]",(allocator *)&dest);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x5f,&local_48,pcVar4);
  }
  else {
    iVar1 = socket(2,1,0);
    if (iVar1 < 0) {
      std::__cxx11::string::string((string *)&local_48,"error [%s]",&local_49);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x69,&local_48,pcVar4);
    }
    else {
      bzero(&dest,0x10);
      dest.sin_family = 2;
      dest.sin_port = this->m_nLsnPort << 8 | this->m_nLsnPort >> 8;
      iVar2 = inet_aton("127.0.0.1",(in_addr *)&dest.sin_addr);
      if (iVar2 != 0) {
        iVar2 = connect(iVar1,(sockaddr *)&dest,0x10);
        if (iVar2 < 0) {
          std::__cxx11::string::string((string *)&local_48,"error [%s]",&local_49);
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x78,&local_48,pcVar4);
          std::__cxx11::string::~string((string *)&local_48);
        }
        close(iVar1);
        iVar1 = (*this->m_pHandler->_vptr_IRequestHandler[3])();
        if ((char)iVar1 != '\0') {
          return true;
        }
        std::__cxx11::string::string((string *)&local_48,"m_pHandler dispose failed.",&local_49);
        Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x7d,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        return true;
      }
      std::__cxx11::string::string((string *)&local_48,"error [%s]",&local_49);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x72,&local_48,pcVar4);
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return false;
}

Assistant:

virtual bool dispose()    
            {
                m_bShutdown=true;
                if (SOCKET_ERROR==closesocket(m_lsnSock))
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }


                int sockfd;
                struct sockaddr_in dest;

                if ((sockfd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                bzero(&dest, sizeof(dest));
                dest.sin_family = AF_INET;
                dest.sin_port = htons(m_nLsnPort);
                if (inet_aton("127.0.0.1", (struct in_addr *) &dest.sin_addr.s_addr) == 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                if (connect(sockfd, (struct sockaddr *) &dest, sizeof(dest)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                }
                close(sockfd);
                if(!m_pHandler->dispose())
                {
                    LogFatal("m_pHandler dispose failed.");
                }
                return true;
            }